

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O1

void bonk_dsp(t_bonk *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_sample **pptVar3;
  long lVar4;
  
  iVar1 = (*sp)->s_n;
  iVar2 = x->x_ninsig;
  x->x_sr = (*sp)->s_sr;
  if (0 < iVar2) {
    pptVar3 = &x->x_insig->g_invec;
    lVar4 = 0;
    do {
      *pptVar3 = sp[lVar4]->s_vec;
      pptVar3 = pptVar3 + 0x4b3;
      lVar4 = lVar4 + 1;
    } while (iVar2 != (int)lVar4);
  }
  dsp_add(bonk_perform,2,x,(long)iVar1);
  return;
}

Assistant:

static void bonk_dsp(t_bonk *x, t_signal **sp)
{
    int i, n = sp[0]->s_n, ninsig = x->x_ninsig;
    t_insig *gp;
    
    x->x_sr = sp[0]->s_sr;
    
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        gp->g_invec = (*(sp++))->s_vec;
    
    dsp_add(bonk_perform, 2, x, (t_int)n);
}